

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sort.cpp
# Opt level: O1

void ON_SortIntArray(sort_algorithm sort_algorithm,int *a,size_t nel)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  ulong uVar10;
  int *piVar11;
  int *lostk [62];
  undefined8 auStack_3f8 [62];
  undefined8 auStack_208 [62];
  
  if (sort_algorithm == heap_sort) {
    if (1 < nel && a != (int *)0x0) {
      uVar5 = nel >> 1;
      piVar4 = a + (nel - 1);
      uVar6 = nel - 1;
      do {
        if (uVar5 == 0) {
          iVar3 = *piVar4;
          *piVar4 = *a;
          uVar6 = uVar6 - 1;
          if (uVar6 == 0) {
            *a = iVar3;
            return;
          }
          piVar4 = piVar4 + -1;
          uVar5 = 0;
        }
        else {
          iVar3 = a[uVar5 - 1];
          uVar5 = uVar5 - 1;
        }
        piVar8 = a + uVar5;
        if (uVar5 * 2 < uVar6) {
          uVar10 = uVar5 * 2 | 1;
          do {
            piVar7 = a + uVar10;
            if (uVar10 < uVar6) {
              piVar9 = piVar7 + 1;
              iVar1 = *piVar7;
              if (iVar1 < *piVar9) {
                piVar7 = piVar7 + 1;
              }
              uVar10 = uVar10 + (iVar1 < *piVar9);
            }
            uVar2 = uVar6;
            if (iVar3 < *piVar7) {
              *piVar8 = *piVar7;
              piVar8 = piVar7;
              uVar2 = uVar10 * 2;
            }
            uVar10 = uVar2 + 1;
          } while (uVar10 <= uVar6);
        }
        *piVar8 = iVar3;
      } while( true );
    }
  }
  else if (1 < nel && a != (int *)0x0) {
    uVar5 = 0;
    piVar4 = a + (nel - 1);
LAB_005bbae4:
    while( true ) {
      iVar3 = (int)uVar5;
      uVar6 = ((long)piVar4 - (long)a >> 2) + 1;
      if (uVar6 < 9) break;
      piVar8 = (int *)((long)a + (uVar6 & 0xfffffffffffffffe) * 2);
      iVar1 = *a;
      if (*piVar8 < iVar1) {
        *a = *piVar8;
        *piVar8 = iVar1;
      }
      iVar1 = *a;
      if (*piVar4 < iVar1) {
        *a = *piVar4;
        *piVar4 = iVar1;
      }
      iVar1 = *piVar8;
      piVar7 = a;
      piVar9 = piVar4;
      if (*piVar4 < iVar1) {
        *piVar8 = *piVar4;
        *piVar4 = iVar1;
      }
LAB_005bbb36:
      if (piVar7 < piVar8) {
        do {
          piVar7 = piVar7 + 1;
          if (piVar8 <= piVar7) break;
        } while (*piVar7 <= *piVar8);
      }
      if (piVar8 <= piVar7) {
        do {
          piVar7 = piVar7 + 1;
          if (piVar4 < piVar7) break;
        } while (*piVar7 <= *piVar8);
      }
      do {
        piVar11 = piVar9;
        piVar9 = piVar11 + -1;
        if (piVar9 <= piVar8) break;
      } while (*piVar8 < *piVar9);
      if (piVar7 <= piVar9) {
        iVar1 = *piVar7;
        *piVar7 = *piVar9;
        *piVar9 = iVar1;
        if (piVar9 == piVar8) {
          piVar8 = piVar7;
        }
        goto LAB_005bbb36;
      }
      if (piVar8 < piVar11) {
        do {
          piVar11 = piVar9;
          if (piVar11 <= piVar8) break;
          piVar9 = piVar11 + -1;
        } while (*piVar11 == *piVar8);
      }
      if (piVar11 <= piVar8) {
        do {
          piVar11 = piVar11 + -1;
          if (piVar11 <= a) break;
        } while (*piVar11 == *piVar8);
      }
      if ((long)piVar11 - (long)a < (long)piVar4 - (long)piVar7) goto LAB_005bbc64;
      if (a < piVar11) {
        auStack_208[iVar3] = a;
        auStack_3f8[iVar3] = piVar11;
        uVar5 = (ulong)(iVar3 + 1);
      }
      iVar3 = (int)uVar5;
      a = piVar7;
      if (piVar4 <= piVar7) goto LAB_005bbc87;
    }
    for (; piVar7 = a, piVar8 = a, a < piVar4; piVar4 = piVar4 + -1) {
      while (piVar9 = piVar7, piVar8 = piVar8 + 1, piVar8 <= piVar4) {
        piVar7 = piVar8;
        if (*piVar8 <= *piVar9) {
          piVar7 = piVar9;
        }
      }
      iVar1 = *piVar9;
      *piVar9 = *piVar4;
      *piVar4 = iVar1;
    }
    goto LAB_005bbc87;
  }
  return;
LAB_005bbc64:
  if (piVar7 < piVar4) {
    auStack_208[iVar3] = piVar7;
    auStack_3f8[iVar3] = piVar4;
    uVar5 = (ulong)(iVar3 + 1);
  }
  iVar3 = (int)uVar5;
  piVar4 = piVar11;
  if (piVar11 <= a) {
LAB_005bbc87:
    if (iVar3 < 1) {
      return;
    }
    uVar5 = (ulong)(iVar3 - 1);
    a = (int *)auStack_208[uVar5];
    piVar4 = (int *)auStack_3f8[uVar5];
  }
  goto LAB_005bbae4;
}

Assistant:

void ON_SortIntArray(
        ON::sort_algorithm sort_algorithm,
        int* a,
        size_t nel
        )
{
  if ( ON::sort_algorithm::heap_sort == sort_algorithm )
    ON_hsort_int(a,nel);
  else
    ON_qsort_int(a,nel);
}